

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp_world.cpp
# Opt level: O3

bool __thiscall despot::POMDPWorld::ExecuteAction(POMDPWorld *this,ACT_TYPE action,OBS_TYPE *obs)

{
  State *pSVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  ostream *this_00;
  long *plVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)action;
  iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
  if (iVar3 <= action) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"WARNING: Planned action ",0x18);
    this_00 = (ostream *)std::ostream::operator<<(&std::cout,action);
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00," set to maximum allowed value ",0x1e);
    iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
    plVar4 = (long *)std::ostream::operator<<(this_00,iVar3 + -1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    iVar3 = (*this->model_->_vptr_DSPOMDP[5])();
    uVar5 = (ulong)(iVar3 - 1);
  }
  pSVar1 = (this->super_World).state_;
  pDVar2 = this->model_;
  Random::NextDouble(&this->random_);
  iVar3 = (*pDVar2->_vptr_DSPOMDP[2])(pDVar2,pSVar1,uVar5,&this->step_reward_,obs);
  return SUB41(iVar3,0);
}

Assistant:

bool POMDPWorld::ExecuteAction(ACT_TYPE action, OBS_TYPE& obs) {
	if (action >= model_->NumActions()) {
		cout << "WARNING: Planned action " << action << 
			" set to maximum allowed value " << (model_->NumActions() - 1) << endl;
		action = model_->NumActions() - 1;
	}
	bool terminal = model_->Step(*state_, random_.NextDouble(), action,
			step_reward_, obs);
	return terminal;
}